

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O1

Error asmjit::v1_14::x86::FuncInternal::initFuncDetail
                (FuncDetail *func,FuncSignature *signature,uint32_t registerSize)

{
  byte *pbVar1;
  FuncDetail FVar2;
  FuncDetail FVar3;
  RegType RVar4;
  ulong uVar5;
  FuncValue *pFVar6;
  RegOrder *pRVar7;
  uint32_t uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  uint32_t valueIndex;
  FuncDetail *pFVar13;
  size_t sVar14;
  uint32_t valueIndex_1;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint local_8c;
  RegGroup local_85 [5];
  FuncDetail *local_80;
  FuncDetail *local_78;
  FuncDetail *local_70;
  ulong local_68;
  FuncDetail *local_60;
  uint32_t local_54;
  ulong local_50;
  FuncDetail *local_48;
  FuncSignature *local_40;
  ulong local_38;
  
  FVar2 = func[4];
  uVar5 = (ulong)(byte)func[0x74];
  local_78 = func;
  local_54 = registerSize;
  local_50 = uVar5;
  local_40 = signature;
  if (*(int *)(func + 0x8c) != 0) {
    pFVar13 = func + 0x8c;
    FVar3 = *func;
    unpackValues(func,(FuncValuePack *)pFVar13);
    local_80 = (FuncDetail *)CONCAT71(local_80._1_7_,FVar3);
    uVar5 = 0xc000000;
    local_70 = (FuncDetail *)0x16000000;
    if (((byte)FVar3 & 1) == 0) {
      local_70 = (FuncDetail *)0xc000000;
    }
    iVar16 = 0x16000100;
    uVar15 = 0;
    do {
      if (uVar15 == 4) {
        iVar10 = 2;
        break;
      }
      pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
      uVar9 = pFVar6->_data;
      uVar12 = uVar9 & 0xff;
      iVar10 = 1;
      switch(uVar12) {
      case 0x22:
      case 0x24:
      case 0x26:
        uVar5 = 0;
        if (uVar15 < 2) {
          pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
          uVar8 = (uint)""[uVar15] << 0x10 | 0x6000126;
LAB_00145acc:
          pFVar6->_data = uVar8;
          uVar5 = CONCAT71((int7)((ulong)pFVar6 >> 8),1);
          iVar10 = 0;
        }
        break;
      case 0x23:
      case 0x25:
      case 0x27:
        uVar5 = 0;
        if (uVar15 < 2) {
          pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
          uVar8 = (uint)""[uVar15] << 0x10 | 0x6000127;
          goto LAB_00145acc;
        }
        break;
      case 0x28:
      case 0x29:
        uVar5 = 0;
        iVar10 = 1;
        if (uVar15 < 2) {
          pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
          uVar8 = (uint)""[uVar15] * 0x10000 + uVar12 + 0x7000100;
          goto LAB_00145acc;
        }
        break;
      case 0x2a:
      case 0x2b:
        pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
        iVar10 = (int)local_70 + iVar16 + uVar12;
        goto LAB_00145b4b;
      case 0x2c:
        pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
        pFVar6->_data = uVar12 + iVar16;
        goto LAB_00145b5f;
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
switchD_00145a14_caseD_2d:
        pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
        bVar11 = (byte)uVar9;
        uVar9 = (uint)(0x5a < bVar11) * 0x1000000 + 0xd000000;
        if (bVar11 < 0x51) {
          uVar9 = 0xc000000;
        }
        iVar10 = (uVar9 | uVar12) + iVar16;
LAB_00145b4b:
        pFVar6->_data = iVar10 + 0xea000000;
LAB_00145b5f:
        uVar5 = CONCAT71((int7)((ulong)pFVar6 >> 8),1);
        iVar10 = 0;
        break;
      case 0x31:
      case 0x32:
        uVar9 = (uint)uVar15;
        if (((ulong)local_80 & 1) == 0) {
          uVar17 = 0xc000000;
          if (local_78[2] != (FuncDetail)0x0) {
            uVar9 = (uint)""[uVar15];
            uVar17 = 0x7000000;
          }
          if (uVar9 == 0xff) {
            uVar5 = 0;
            iVar10 = 1;
            break;
          }
        }
        else {
          uVar17 = 0x12000000;
        }
        pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,uVar15);
        pFVar6->_data = uVar12 | uVar9 << 0x10 | uVar17 | 0x100;
        iVar10 = 0;
        uVar5 = CONCAT71((int7)((ulong)pFVar6 >> 8),1);
        break;
      default:
        if (uVar12 != 0) goto switchD_00145a14_caseD_2d;
        uVar5 = 0;
        iVar10 = 2;
      }
      uVar15 = uVar15 + 1;
      iVar16 = iVar16 + 0x10000;
    } while ((char)uVar5 != '\0');
    if (iVar10 != 2) {
      return 3;
    }
  }
  local_8c = (uint)(byte)FVar2;
  local_68 = CONCAT71((int7)(uVar5 >> 8),local_78[2]);
  if ((byte)((char)local_78[2] - 1U) < 2) {
    local_60 = local_78 + 0x9c;
    local_70 = local_78 + 0x34;
    for (local_80 = (FuncDetail *)0x0; pFVar13 = local_78, local_80 != (FuncDetail *)local_50;
        local_80 = (FuncDetail *)((long)local_80 + 1)) {
      pFVar13 = local_60 + (long)local_80 * 0x10;
      unpackValues(local_78,(FuncValuePack *)pFVar13);
      for (sVar14 = 0; sVar14 != 4; sVar14 = sVar14 + 1) {
        pFVar6 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,sVar14);
        uVar9 = pFVar6->_data;
        if (uVar9 == 0) {
          iVar16 = 0x10;
        }
        else {
          uVar12 = uVar9 & 0xff;
          if (uVar12 - 0x31 < 2 || uVar12 - 0x20 < 10) {
            bVar11 = TypeUtils::_typeData[(ulong)(uVar9 & 0xff) + 0x100];
            uVar8 = 0xff;
            if (local_80 < 0x10) {
              local_85[2] = 0;
              pRVar7 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_70,
                                  local_85 + 2);
              uVar8 = (uint32_t)pRVar7->id[(long)local_80];
            }
            if (uVar8 == 0xff) {
LAB_00145cba:
              FuncValue::assignStackOffset(pFVar6,local_8c);
LAB_00145cc8:
              local_8c = local_8c + 8;
            }
            else {
              if (bVar11 < 5) {
                RVar4 = uVar12 - 0x31 < 2 | kARM_GpW;
              }
              else {
                RVar4 = kARM_GpX;
              }
              FuncValue::assignRegData(pFVar6,RVar4,uVar8);
              *(uint *)(local_78 + 0x78) = *(uint *)(local_78 + 0x78) | 1 << ((byte)uVar8 & 0x1f);
            }
          }
          else {
            uVar17 = uVar12 - 0x2a;
            iVar16 = 0;
            if (0x31 < uVar12 - 0x33 && 2 < uVar17) goto LAB_00145de6;
            uVar8 = 0xff;
            if (local_80 < 0x10) {
              local_85[1] = 1;
              pRVar7 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_70,
                                  local_85 + 1);
              uVar8 = (uint32_t)pRVar7->id[(long)local_80];
            }
            if (((char)local_68 != '\x02' && 2 < uVar17) || (uVar8 == 0xff)) {
              if (uVar17 < 3) goto LAB_00145cba;
              local_85[0] = k0;
              pRVar7 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_70,local_85
                                 );
              if (pRVar7->id[(long)local_80] == 0xff) {
                FuncValue::assignStackOffset(pFVar6,local_8c);
              }
              else {
                FuncValue::assignRegData(pFVar6,kARM_GpX,(uint)pRVar7->id[(long)local_80]);
              }
              pbVar1 = (byte *)((long)&pFVar6->_data + 1);
              *pbVar1 = *pbVar1 | 4;
              goto LAB_00145cc8;
            }
            RVar4 = kVec512 - ((byte)uVar9 < 0x5b);
            if ((byte)uVar9 < 0x51) {
              RVar4 = kARM_VecQ;
            }
            FuncValue::assignRegData(pFVar6,RVar4,uVar8);
            *(uint *)(local_78 + 0x7c) = *(uint *)(local_78 + 0x7c) | 1 << ((byte)uVar8 & 0x1f);
          }
          iVar16 = 0x12;
        }
LAB_00145de6:
        if ((iVar16 != 0x12) && (iVar16 != 0)) break;
      }
    }
  }
  else {
    local_48 = local_78 + 0x9c;
    local_60 = local_78 + 0x34;
    local_68 = uVar5 & 0xffffffff00000000;
    uVar5 = 0;
    pFVar13 = local_78;
    for (local_38 = 0; local_38 != local_50; local_38 = local_38 + 1) {
      local_80 = local_48 + local_38 * 0x10;
      unpackValues(pFVar13,(FuncValuePack *)local_80);
      for (sVar14 = 0; sVar14 != 4; sVar14 = sVar14 + 1) {
        pFVar6 = FuncValuePack::operator[]((FuncValuePack *)local_80,sVar14);
        uVar9 = pFVar6->_data;
        uVar15 = (ulong)uVar9;
        if (uVar15 == 0) {
          iVar16 = 10;
        }
        else {
          bVar11 = (byte)uVar9;
          uVar9 = uVar9 & 0xff;
          uVar12 = (uint)uVar5;
          if (uVar9 - 0x20 < 10) {
            uVar8 = 0xff;
            if (uVar12 < 0x10) {
              local_85[4] = 0;
              pRVar7 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_60,
                                  local_85 + 4);
              uVar8 = (uint32_t)pRVar7->id[uVar5];
            }
            if (uVar8 == 0xff) {
              uVar9 = (uint)(byte)TypeUtils::_typeData[(uVar15 & 0xff) + 0x100];
              if ((byte)TypeUtils::_typeData[(uVar15 & 0xff) + 0x100] <= local_54) {
                uVar9 = local_54;
              }
              FuncValue::assignStackOffset(pFVar6,local_8c);
              local_8c = local_8c + uVar9;
            }
            else {
              FuncValue::assignRegData(pFVar6,kARM_GpX - (bVar11 < 0x28),uVar8);
              *(uint *)(pFVar13 + 0x78) = *(uint *)(pFVar13 + 0x78) | 1 << ((byte)uVar8 & 0x1f);
              uVar5 = (ulong)(uVar12 + 1);
            }
            iVar16 = 0xc;
          }
          else {
            local_70 = (FuncDetail *)CONCAT44(local_70._4_4_,uVar12);
            iVar16 = 0;
            if (uVar9 - 0x33 < 0x32 || uVar9 - 0x2a < 3) {
              uVar8 = 0xff;
              if ((uint)local_68 < 0x10) {
                local_85[3] = 1;
                pRVar7 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                         operator[]<asmjit::v1_14::RegGroup>
                                   ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_60,
                                    local_85 + 3);
                uVar8 = (uint32_t)pRVar7->id[local_68 & 0xffffffff];
              }
              if (uVar9 - 0x2a < 3) {
                if (((byte)local_78[8] & 4) == 0) {
                  uVar8 = 0xff;
                }
              }
              else if ((local_40->_vaIndex != 0xff) && (((byte)local_78[8] & 8) != 0)) {
                uVar8 = 0xff;
              }
              uVar5 = (ulong)local_70 & 0xffffffff;
              if (uVar8 == 0xff) {
                bVar11 = TypeUtils::_typeData[(uVar15 & 0xff) + 0x100];
                FuncValue::assignStackOffset(pFVar6,local_8c);
                local_8c = local_8c + bVar11;
                iVar16 = 0xc;
                pFVar13 = local_78;
              }
              else {
                pFVar6->_data = uVar9;
                RVar4 = kVec512 - (bVar11 < 0x5b);
                iVar16 = 0xc;
                if (bVar11 < 0x51) {
                  RVar4 = kARM_VecQ;
                }
                FuncValue::assignRegData(pFVar6,RVar4,uVar8);
                *(uint *)(local_78 + 0x7c) = *(uint *)(local_78 + 0x7c) | 1 << ((byte)uVar8 & 0x1f);
                local_68 = CONCAT44(local_68._4_4_,(uint)local_68 + 1);
                pFVar13 = local_78;
              }
            }
          }
        }
        if ((iVar16 != 0xc) && (iVar16 != 0)) break;
      }
    }
  }
  *(uint *)(pFVar13 + 0x88) = local_8c;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature, uint32_t registerSize) noexcept {
  const CallConv& cc = func.callConv();
  Arch arch = cc.arch();
  uint32_t stackOffset = cc._spillZoneSize;
  uint32_t argCount = func.argCount();

  // Up to two return values can be returned in GP registers.
  static const uint8_t gpReturnIndexes[4] = {
    uint8_t(Gp::kIdAx),
    uint8_t(Gp::kIdDx),
    uint8_t(BaseReg::kIdBad),
    uint8_t(BaseReg::kIdBad)
  };

  if (func.hasRet()) {
    unpackValues(func, func._rets);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt64:
        case TypeId::kUInt64: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpq, gpReturnIndexes[valueIndex], typeId);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpd, gpReturnIndexes[valueIndex], TypeId::kInt32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpd, gpReturnIndexes[valueIndex], TypeId::kUInt32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kFloat32:
        case TypeId::kFloat64: {
          RegType regType = Environment::is32Bit(arch) ? RegType::kX86_St : RegType::kX86_Xmm;
          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }

        case TypeId::kFloat80: {
          // 80-bit floats are always returned by FP0.
          func._rets[valueIndex].initReg(RegType::kX86_St, valueIndex, typeId);
          break;
        }

        case TypeId::kMmx32:
        case TypeId::kMmx64: {
          // MM registers are returned through XMM (SystemV) or GPQ (Win64).
          RegType regType = RegType::kX86_Mm;
          uint32_t regIndex = valueIndex;
          if (Environment::is64Bit(arch)) {
            regType = cc.strategy() == CallConvStrategy::kDefault ? RegType::kX86_Xmm : RegType::kX86_Gpq;
            regIndex = cc.strategy() == CallConvStrategy::kDefault ? valueIndex : gpReturnIndexes[valueIndex];

            if (regIndex == BaseReg::kIdBad)
              return DebugUtils::errored(kErrorInvalidState);
          }

          func._rets[valueIndex].initReg(regType, regIndex, typeId);
          break;
        }

        default: {
          func._rets[valueIndex].initReg(vecTypeIdToRegType(typeId), valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    default: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          TypeId typeId = arg.typeId();

          if (TypeUtils::isInt(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (gpzPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

            if (regId != BaseReg::kIdBad) {
              RegType regType = typeId <= TypeId::kUInt32 ? RegType::kX86_Gpd : RegType::kX86_Gpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
              gpzPos++;
            }
            else {
              uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), registerSize);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }

          if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (vecPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

            if (TypeUtils::isFloat(typeId)) {
              // If this is a float, but `kFlagPassFloatsByVec` is false, we have to use stack instead. This should
              // be only used by 32-bit calling conventions.
              if (!cc.hasFlag(CallConvFlags::kPassFloatsByVec))
                regId = BaseReg::kIdBad;
            }
            else {
              // Pass vector registers via stack if this is a variable arguments function. This should be only used
              // by 32-bit calling conventions.
              if (signature.hasVarArgs() && cc.hasFlag(CallConvFlags::kPassVecByStackIfVA))
                regId = BaseReg::kIdBad;
            }

            if (regId != BaseReg::kIdBad) {
              arg.initTypeId(typeId);
              arg.assignRegData(vecTypeIdToRegType(typeId), regId);
              func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
              vecPos++;
            }
            else {
              uint32_t size = TypeUtils::sizeOf(typeId);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }
        }
      }
      break;
    }

    case CallConvStrategy::kX64Windows:
    case CallConvStrategy::kX64VectorCall: {
      // Both X64 and VectorCall behave similarly - arguments are indexed from left to right. The position of the
      // argument determines in which register the argument is allocated, so it's either GP or one of XMM/YMM/ZMM
      // registers.
      //
      //       [       X64       ] [VecCall]
      // Index: #0   #1   #2   #3   #4   #5
      //
      // GP   : RCX  RDX  R8   R9
      // VEC  : XMM0 XMM1 XMM2 XMM3 XMM4 XMM5
      //
      // For example function `f(int a, double b, int c, double d)` will be:
      //
      //        (a)  (b)  (c)  (d)
      //        RCX  XMM1 R8   XMM3
      //
      // Unused vector registers are used by HVA.
      bool isVectorCall = (cc.strategy() == CallConvStrategy::kX64VectorCall);

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          TypeId typeId = arg.typeId();
          uint32_t size = TypeUtils::sizeOf(typeId);

          if (TypeUtils::isInt(typeId) || TypeUtils::isMmx(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kGp].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              RegType regType = size <= 4 && !TypeUtils::isMmx(typeId) ? RegType::kX86_Gpd : RegType::kX86_Gpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            }
            else {
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += 8;
            }
            continue;
          }

          if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kVec].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              // X64-ABI doesn't allow vector types (XMM|YMM|ZMM) to be passed via registers, however, VectorCall
              // was designed for that purpose.
              if (TypeUtils::isFloat(typeId) || isVectorCall) {
                RegType regType = vecTypeIdToRegType(typeId);
                arg.assignRegData(regType, regId);
                func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
                continue;
              }
            }

            // Passed via stack if the argument is float/double or indirectly. The trap is - if the argument is
            // passed indirectly, the address can be passed via register, if the argument's index has GP one.
            if (TypeUtils::isFloat(typeId)) {
              arg.assignStackOffset(int32_t(stackOffset));
            }
            else {
              uint32_t gpRegId = cc._passedOrder[RegGroup::kGp].id[argIndex];
              if (gpRegId != BaseReg::kIdBad)
                arg.assignRegData(RegType::kX86_Gpq, gpRegId);
              else
                arg.assignStackOffset(int32_t(stackOffset));
              arg.addFlags(FuncValue::kFlagIsIndirect);
            }

            // Always 8 bytes (float/double/pointer).
            stackOffset += 8;
            continue;
          }
        }
      }
      break;
    }
  }

  func._argStackSize = stackOffset;
  return kErrorOk;
}